

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strassen-lace.c
# Opt level: O3

void matrixmul(int n,REAL *A,int an,REAL *B,int bn,REAL *C,int cn)

{
  REAL *pRVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  double dVar7;
  
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
    uVar3 = 0;
    do {
      uVar5 = 0;
      pRVar1 = B;
      do {
        dVar7 = 0.0;
        uVar4 = 0;
        pdVar6 = pRVar1;
        do {
          dVar7 = dVar7 + A[uVar4] * *pdVar6;
          uVar4 = uVar4 + 1;
          pdVar6 = pdVar6 + bn;
        } while (uVar2 != uVar4);
        C[uVar3 * (long)cn + uVar5] = dVar7;
        uVar5 = uVar5 + 1;
        pRVar1 = pRVar1 + 1;
      } while (uVar5 != uVar2);
      uVar3 = uVar3 + 1;
      A = A + an;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void matrixmul(int n, REAL *A, int an, REAL *B, int bn, REAL *C, int cn)
{
    int i, j, k;
    REAL s;

    for (i = 0; i < n; ++i)
        for (j = 0; j < n; ++j) {
            s = 0.0;
            for (k = 0; k < n; ++k)
                s += ELEM(A, an, i, k) * ELEM(B, bn, k, j);

            ELEM(C, cn, i, j) = s;
        }
}